

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterOpenTempFile(sqlite3 *db,i64 nExtend,sqlite3_file **ppFd)

{
  long lVar1;
  int iVar2;
  undefined8 in_RDX;
  int flags;
  sqlite3_file **in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  i64 max;
  int rc;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  flags = (int)((ulong)in_RDX >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3FaultSim(in_stack_ffffffffffffffc4);
  if (iVar2 == 0) {
    iVar2 = sqlite3OsOpenMalloc((sqlite3_vfs *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI
                                ,in_RSI,flags,
                                (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               );
    if ((iVar2 == 0) &&
       (sqlite3OsFileControlHint
                  ((sqlite3_file *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffbc,(void *)0x199d0d), 0 < (long)in_RSI)) {
      vdbeSorterExtendFile
                ((sqlite3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (sqlite3_file *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (i64)in_RDI);
    }
  }
  else {
    iVar2 = 0xd0a;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int vdbeSorterOpenTempFile(
  sqlite3 *db,                    /* Database handle doing sort */
  i64 nExtend,                    /* Attempt to extend file to this size */
  sqlite3_file **ppFd
){
  int rc;
  if( sqlite3FaultSim(202) ) return SQLITE_IOERR_ACCESS;
  rc = sqlite3OsOpenMalloc(db->pVfs, 0, ppFd,
      SQLITE_OPEN_TEMP_JOURNAL |
      SQLITE_OPEN_READWRITE    | SQLITE_OPEN_CREATE |
      SQLITE_OPEN_EXCLUSIVE    | SQLITE_OPEN_DELETEONCLOSE, &rc
  );
  if( rc==SQLITE_OK ){
    i64 max = SQLITE_MAX_MMAP_SIZE;
    sqlite3OsFileControlHint(*ppFd, SQLITE_FCNTL_MMAP_SIZE, (void*)&max);
    if( nExtend>0 ){
      vdbeSorterExtendFile(db, *ppFd, nExtend);
    }
  }
  return rc;
}